

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

_Bool malloc_init_hard(void)

{
  int8_t *piVar1;
  malloc_init_t mVar2;
  pthread_t pVar3;
  _Bool _Var4;
  int iVar5;
  pthread_t pVar6;
  tsd_t *ptVar7;
  long lVar8;
  percpu_arena_mode_t pVar9;
  spin_t spinner;
  uint uVar10;
  char *in_FS_OFFSET;
  uint local_2c;
  
  iVar5 = pthread_mutex_trylock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
  if (iVar5 != 0) {
    malloc_mutex_lock_slow(&init_lock);
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  pVar3 = malloc_initializer;
  mVar2 = malloc_init_state;
  init_lock.field_0.field_0.prof_data.n_lock_ops =
       init_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (init_lock.field_0.field_0.prof_data.prev_owner != (tsdn_t *)0x0) {
    init_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)0x0;
    init_lock.field_0.witness.link.qre_prev =
         (witness_t *)(init_lock.field_0.field_0.prof_data.n_owner_switches + 1);
  }
  if ((malloc_init_state == malloc_init_initialized) ||
     (pVar6 = pthread_self(), mVar2 == malloc_init_recursible && pVar3 == pVar6)) {
LAB_0013ad40:
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
    return false;
  }
  if (pVar3 != 0 && pVar3 != pVar6) {
    uVar10 = 0;
    do {
      init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
      if (uVar10 < 5) {
        for (local_2c = 0; local_2c >> ((byte)uVar10 & 0x1f) == 0; local_2c = local_2c + 1) {
        }
        uVar10 = uVar10 + 1;
      }
      else {
        sched_yield();
      }
      iVar5 = pthread_mutex_trylock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
      if (iVar5 != 0) {
        malloc_mutex_lock_slow(&init_lock);
      }
      init_lock.field_0.field_0.prof_data.n_lock_ops =
           init_lock.field_0.field_0.prof_data.n_lock_ops + 1;
      if (init_lock.field_0.field_0.prof_data.prev_owner != (tsdn_t *)0x0) {
        init_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)0x0;
        init_lock.field_0.witness.link.qre_prev =
             (witness_t *)(init_lock.field_0.field_0.prof_data.n_owner_switches + 1);
      }
    } while (malloc_init_state != malloc_init_initialized);
    goto LAB_0013ad40;
  }
  if ((malloc_init_state != malloc_init_a0_initialized) &&
     (_Var4 = malloc_init_hard_a0_locked(), _Var4)) {
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
    return true;
  }
  init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
  ptVar7 = malloc_tsd_boot0();
  if (ptVar7 == (tsd_t *)0x0) {
    return true;
  }
  malloc_init_state = malloc_init_recursible;
  lVar8 = sysconf(0x54);
  ncpus = (uint)lVar8;
  if (lVar8 == -1) {
    ncpus = 1;
  }
  iVar5 = pthread_atfork(jemalloc_prefork,jemalloc_postfork_parent,jemalloc_postfork_child);
  if (iVar5 != 0) {
    malloc_write("<jemalloc>: Error in pthread_atfork()\n");
    if (opt_abort != true) {
      return true;
    }
    goto LAB_0013ade6;
  }
  _Var4 = background_thread_boot0();
  if (_Var4) {
    return true;
  }
  iVar5 = pthread_mutex_trylock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
  if (iVar5 != 0) {
    malloc_mutex_lock_slow(&init_lock);
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  init_lock.field_0.field_0.prof_data.n_lock_ops =
       init_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(init_lock.field_0.field_0.prof_data.prev_owner)->tsd != ptVar7) {
    init_lock.field_0.witness.link.qre_prev =
         (witness_t *)(init_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    init_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)ptVar7;
  }
  ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
       ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
  if ((ptVar7->state).repr == '\0') {
    tsd_slow_update(ptVar7);
  }
  if (opt_percpu_arena != percpu_arena_disabled) {
    iVar5 = sched_getcpu();
    if (iVar5 < 0) {
      opt_percpu_arena = percpu_arena_disabled;
      malloc_printf("<jemalloc>: perCPU arena getcpu() not available. Setting narenas to %u.\n");
      if (opt_abort == true) goto LAB_0013ade6;
    }
    else {
      if (0xffe < ncpus) {
        malloc_printf("<jemalloc>: narenas w/ percpuarena beyond limit (%d)\n");
        if (opt_abort == true) goto LAB_0013ade6;
        goto LAB_0013afd0;
      }
      if ((((ncpus & 1) != 0) && (opt_percpu_arena == per_phycpu_arena_uninit)) &&
         (malloc_printf(
                       "<jemalloc>: invalid configuration -- per physical CPU arena with odd number (%u) of CPUs (no hyper threading?).\n"
                       ), opt_abort == true)) {
LAB_0013ade6:
        abort();
      }
      uVar10 = (ncpus >> 1) + (ncpus & 1);
      if (ncpus < 2) {
        uVar10 = ncpus;
      }
      if (opt_percpu_arena != per_phycpu_arena_uninit) {
        uVar10 = ncpus;
      }
      if (opt_narenas < uVar10) {
        opt_narenas = uVar10;
      }
    }
  }
  if (opt_narenas == 0) {
    opt_narenas = 1;
    if (1 < ncpus) {
      opt_narenas = ncpus * 4;
    }
  }
  narenas_auto = opt_narenas;
  if (0xffe < opt_narenas) {
    narenas_auto = 0xffe;
    malloc_printf("<jemalloc>: Reducing narenas to limit (%d)\n");
  }
  narenas_total.repr = narenas_auto;
  _Var4 = arena_init_huge();
  if (_Var4) {
    LOCK();
    narenas_total.repr = narenas_total.repr + 1;
    UNLOCK();
  }
  manual_arena_base = narenas_total.repr;
  _Var4 = background_thread_boot1((tsdn_t *)ptVar7);
  if (!_Var4) {
    pVar9 = opt_percpu_arena + percpu_arena;
    if (opt_percpu_arena == percpu_arena_disabled) {
      pVar9 = opt_percpu_arena;
    }
    opt_percpu_arena = pVar9;
    _Var4 = malloc_mutex_boot();
    if (!_Var4) {
      malloc_init_state = malloc_init_initialized;
      malloc_slow_flags =
           opt_utrace << 3 | opt_zero << 2 | opt_junk_free * '\x02' | opt_junk_alloc |
           malloc_slow_flags | opt_xmalloc << 4;
      malloc_slow = malloc_slow_flags != 0;
      piVar1 = &ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == '\0') {
        tsd_slow_update(ptVar7);
      }
      init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
      malloc_tsd_boot1();
      ptVar7 = *(tsd_t **)in_FS_OFFSET;
      if (*in_FS_OFFSET != '\0') {
        ptVar7 = tsd_fetch_slow(ptVar7,false);
      }
      if (opt_background_thread != true) {
        return false;
      }
      background_thread_ctl_init((tsdn_t *)ptVar7);
      _Var4 = background_thread_create(ptVar7,0);
      if (!_Var4) {
        return false;
      }
      return true;
    }
  }
LAB_0013afd0:
  malloc_init_hard_cleanup((tsdn_t *)ptVar7,true);
  return true;
}

Assistant:

static bool
malloc_init_hard(void) {
	tsd_t *tsd;

#if defined(_WIN32) && _WIN32_WINNT < 0x0600
	_init_init_lock();
#endif
	malloc_mutex_lock(TSDN_NULL, &init_lock);

#define UNLOCK_RETURN(tsdn, ret, reentrancy)		\
	malloc_init_hard_cleanup(tsdn, reentrancy);	\
	return ret;

	if (!malloc_init_hard_needed()) {
		UNLOCK_RETURN(TSDN_NULL, false, false)
	}

	if (malloc_init_state != malloc_init_a0_initialized &&
	    malloc_init_hard_a0_locked()) {
		UNLOCK_RETURN(TSDN_NULL, true, false)
	}

	malloc_mutex_unlock(TSDN_NULL, &init_lock);
	/* Recursive allocation relies on functional tsd. */
	tsd = malloc_tsd_boot0();
	if (tsd == NULL) {
		return true;
	}
	if (malloc_init_hard_recursible()) {
		return true;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &init_lock);
	/* Set reentrancy level to 1 during init. */
	pre_reentrancy(tsd, NULL);
	/* Initialize narenas before prof_boot2 (for allocation). */
	if (malloc_init_narenas() || background_thread_boot1(tsd_tsdn(tsd))) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	if (config_prof && prof_boot2(tsd)) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}

	malloc_init_percpu();

	if (malloc_init_hard_finish()) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	post_reentrancy(tsd);
	malloc_mutex_unlock(tsd_tsdn(tsd), &init_lock);

	witness_assert_lockless(witness_tsd_tsdn(
	    tsd_witness_tsdp_get_unsafe(tsd)));
	malloc_tsd_boot1();
	/* Update TSD after tsd_boot1. */
	tsd = tsd_fetch();
	if (opt_background_thread) {
		assert(have_background_thread);
		/*
		 * Need to finish init & unlock first before creating background
		 * threads (pthread_create depends on malloc).  ctl_init (which
		 * sets isthreaded) needs to be called without holding any lock.
		 */
		background_thread_ctl_init(tsd_tsdn(tsd));
		if (background_thread_create(tsd, 0)) {
			return true;
		}
	}
#undef UNLOCK_RETURN
	return false;
}